

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttribKernelT.hh
# Opt level: O2

void __thiscall
OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
request_edge_colors(AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    *this)

{
  uint uVar1;
  string local_40;
  allocator local_19;
  
  uVar1 = this->refcount_ecolors_;
  this->refcount_ecolors_ = uVar1 + 1;
  if (uVar1 == 0) {
    std::__cxx11::string::string((string *)&local_40,"e:colors",&local_19);
    BaseKernel::add_property<OpenMesh::VectorT<unsigned_char,3>>
              ((BaseKernel *)this,&this->edge_colors_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void request_edge_colors()
  {
    if (!refcount_ecolors_++)
      this->add_property( edge_colors_, "e:colors" );
  }